

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::changeEvent(QLineEdit *this,QEvent *ev)

{
  ushort uVar1;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar2;
  pointer pSVar3;
  QWidget *this_01;
  char cVar4;
  char16_t cVar5;
  int iVar6;
  QPalette *pQVar7;
  QStyle *pQVar8;
  SideWidgetEntry *e;
  pointer pSVar9;
  long in_FS_OFFSET;
  QStyleOptionFrame opt;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(ev + 8);
  if (uVar1 < 99) {
    if (uVar1 == 0x5a) {
      pSVar9 = (this_00->trailingSideWidgets).
               super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this_00->trailingSideWidgets).
               super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar9 != pSVar3) {
        do {
          if ((pSVar9->flags & 4) != 0) {
            this_01 = pSVar9->widget;
            QLineEditPrivate::clearButtonIcon((QLineEditPrivate *)local_88);
            QAbstractButton::setIcon((QAbstractButton *)this_01,(QIcon *)local_88);
            QIcon::~QIcon((QIcon *)local_88);
          }
          pSVar9 = pSVar9 + 1;
        } while (pSVar9 != pSVar3);
      }
      QLineEditPrivate::positionSideWidgets(this_00);
    }
    else if (uVar1 == 0x61) {
      pQVar2 = this_00->control;
      QTextLayout::setFont((QFont *)&pQVar2->m_textLayout);
      QWidgetLineControl::updateDisplayText((QWidgetLineControl *)pQVar2,false);
    }
    goto LAB_00424e13;
  }
  if (uVar1 == 100) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_88);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionFrame *)local_88);
    pQVar2 = this_00->control;
    pQVar8 = QWidget::style(&this->super_QWidget);
    cVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x23,(QStyleOptionFrame *)local_88,this,0);
    (pQVar2->m_passwordCharacter).ucs = cVar5;
    QWidgetLineControl::updateDisplayText((QWidgetLineControl *)pQVar2,false);
    pQVar2 = this_00->control;
    pQVar8 = QWidget::style(&this->super_QWidget);
    iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x67,(QStyleOptionFrame *)local_88,this,0);
    pQVar2->m_passwordMaskDelay = iVar6;
    QStyleOption::~QStyleOption((QStyleOption *)local_88);
  }
  else {
    if (uVar1 != 99) goto LAB_00424e13;
    pQVar7 = QWidget::palette(&this->super_QWidget);
    cVar4 = QPalette::isEqual((ColorGroup)pQVar7,Active);
    if (cVar4 != '\0') goto LAB_00424e13;
  }
  QWidget::update(&this->super_QWidget);
LAB_00424e13:
  QWidget::changeEvent(&this->super_QWidget,ev);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::changeEvent(QEvent *ev)
{
    Q_D(QLineEdit);
    switch(ev->type())
    {
    case QEvent::ActivationChange:
        if (!palette().isEqual(QPalette::Active, QPalette::Inactive))
            update();
        break;
    case QEvent::FontChange:
        d->control->setFont(font());
        break;
    case QEvent::StyleChange:
        {
            QStyleOptionFrame opt;
            initStyleOption(&opt);
            d->control->setPasswordCharacter(char16_t(style()->styleHint(QStyle::SH_LineEdit_PasswordCharacter, &opt, this)));
            d->control->setPasswordMaskDelay(style()->styleHint(QStyle::SH_LineEdit_PasswordMaskDelay, &opt, this));
        }
        update();
        break;
    case QEvent::LayoutDirectionChange:
#if QT_CONFIG(toolbutton)
        for (const auto &e : d->trailingSideWidgets) { // Refresh icon to show arrow in right direction.
            if (e.flags & QLineEditPrivate::SideWidgetClearButton)
                static_cast<QLineEditIconButton *>(e.widget)->setIcon(d->clearButtonIcon());
        }
#endif
        d->positionSideWidgets();
        break;
    default:
        break;
    }
    QWidget::changeEvent(ev);
}